

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkbox.cpp
# Opt level: O3

Component __thiscall
ftxui::Checkbox(ftxui *this,ConstStringRef *label,bool *checked,Ref<ftxui::CheckboxOption> *option)

{
  pointer pcVar1;
  undefined8 *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  Component CVar3;
  long *local_100;
  long local_f8;
  long local_f0 [2];
  string *local_e0;
  undefined1 local_d8 [88];
  _Invoker_type p_Stack_80;
  _Any_data local_78;
  undefined1 local_68 [8];
  _Invoker_type p_Stack_60;
  _Any_data local_58;
  undefined1 local_48 [8];
  _Invoker_type p_Stack_40;
  CheckboxOption *local_38;
  
  puVar2 = (undefined8 *)operator_new(0x120);
  puVar2[1] = 0x100000001;
  *puVar2 = &PTR___Sp_counted_ptr_inplace_00173e80;
  pcVar1 = (label->owned_)._M_dataplus._M_p;
  local_100 = local_f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,pcVar1,pcVar1 + (label->owned_)._M_string_length);
  local_e0 = label->address_;
  CheckboxOption::CheckboxOption((CheckboxOption *)local_d8,&option->owned_);
  local_38 = option->address_;
  puVar2[5] = 0;
  puVar2[6] = 0;
  puVar2[3] = 0;
  puVar2[4] = 0;
  puVar2[2] = &PTR__CheckboxBase_00173ed0;
  puVar2[7] = puVar2 + 9;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar2 + 7),local_100,local_f8 + (long)local_100);
  puVar2[0xb] = local_e0;
  puVar2[0xc] = checked;
  puVar2[0xd] = 0;
  puVar2[0xe] = 0;
  puVar2[0xf] = puVar2 + 0x11;
  if ((undefined1 *)local_d8._0_8_ == local_d8 + 0x10) {
    puVar2[0x11] = CONCAT71(local_d8._17_7_,local_d8[0x10]);
    puVar2[0x12] = local_d8._24_8_;
  }
  else {
    puVar2[0xf] = local_d8._0_8_;
    puVar2[0x11] = CONCAT71(local_d8._17_7_,local_d8[0x10]);
  }
  puVar2[0x10] = local_d8._8_8_;
  local_d8._8_8_ = 0;
  local_d8[0x10] = '\0';
  puVar2[0x13] = puVar2 + 0x15;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._32_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 0x30)) {
    puVar2[0x15] = CONCAT71(local_d8._49_7_,local_d8[0x30]);
    puVar2[0x16] = local_d8._56_8_;
  }
  else {
    puVar2[0x13] = local_d8._32_8_;
    puVar2[0x15] = CONCAT71(local_d8._49_7_,local_d8[0x30]);
  }
  puVar2[0x14] = local_d8._40_8_;
  local_d8._40_8_ = 0;
  local_d8[0x30] = '\0';
  puVar2[0x19] = 0;
  puVar2[0x17] = 0;
  puVar2[0x18] = 0;
  puVar2[0x1a] = p_Stack_80;
  if ((_Manager_type)local_d8._80_8_ != (_Manager_type)0x0) {
    local_d8._32_8_ = local_d8 + 0x50;
    puVar2[0x17] = local_d8._64_8_;
    puVar2[0x18] = local_d8._72_8_;
    puVar2[0x19] = local_d8._80_8_;
    local_d8._80_8_ = (_Manager_type)0x0;
    p_Stack_80 = (_Invoker_type)0x0;
  }
  puVar2[0x1b] = 0;
  puVar2[0x1c] = 0;
  puVar2[0x1d] = 0;
  puVar2[0x1e] = p_Stack_60;
  if (local_68 != (undefined1  [8])0x0) {
    local_d8._32_8_ = local_68;
    puVar2[0x1b] = local_78._M_unused._M_object;
    puVar2[0x1c] = local_78._8_8_;
    puVar2[0x1d] = local_68;
    local_68 = (undefined1  [8])0x0;
    p_Stack_60 = (_Invoker_type)0x0;
  }
  puVar2[0x1f] = 0;
  puVar2[0x20] = 0;
  puVar2[0x21] = 0;
  puVar2[0x22] = p_Stack_40;
  if (local_48 != (undefined1  [8])0x0) {
    local_d8._32_8_ = local_48;
    puVar2[0x1f] = local_58._M_unused._M_object;
    puVar2[0x20] = local_58._8_8_;
    puVar2[0x21] = local_48;
    local_48 = (undefined1  [8])0x0;
    p_Stack_40 = (_Invoker_type)0x0;
  }
  puVar2[0x23] = local_38;
  if (local_100 != local_f0) {
    local_d8._0_8_ = local_d8 + 0x10;
    local_d8._32_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 0x30);
    operator_delete(local_100,local_f0[0] + 1);
    local_d8._32_8_ = extraout_RDX;
  }
  *(undefined8 **)this = puVar2 + 2;
  *(undefined8 **)(this + 8) = puVar2;
  CVar3.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._32_8_;
  CVar3.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Component)CVar3.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component Checkbox(ConstStringRef label,
                   bool* checked,
                   Ref<CheckboxOption> option) {
  return Make<CheckboxBase>(label, checked, std::move(option));
}